

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::add_hl_hl(CPU *this)

{
  CPU *this_local;
  
  add_hl_r16(this,this->regs->h,this->regs->l);
  return 2;
}

Assistant:

int CPU::add_hl_hl() {
    add_hl_r16(regs.h, regs.l);
    return 2;
}